

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

enable_if_t<_detail::move_never<bool>::value,_bool> pybind11::move<bool>(object *obj)

{
  int iVar1;
  cast_error *this;
  bool *pbVar2;
  type_caster local_f3 [2];
  undefined1 local_f1;
  bool ret;
  PyObject *local_c0;
  str local_b8;
  str local_b0 [4];
  char local_90 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30 [32];
  object_api<pybind11::handle> *local_10;
  object *obj_local;
  
  local_10 = (object_api<pybind11::handle> *)obj;
  iVar1 = detail::object_api<pybind11::handle>::ref_count((object_api<pybind11::handle> *)obj);
  if (1 < iVar1) {
    local_f1 = 1;
    this = (cast_error *)__cxa_allocate_exception(0x10);
    local_c0 = (PyObject *)detail::object_api<pybind11::handle>::get_type(local_10);
    str::str(&local_b8,(handle)local_c0);
    str::operator_cast_to_string(local_b0);
    std::operator+(local_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            "Unable to move from Python ");
    std::operator+(local_70,local_90);
    type_id<bool>();
    std::operator+(local_50,local_70);
    std::operator+(local_30,(char *)local_50);
    cast_error::runtime_error(this,local_30);
    local_f1 = 0;
    __cxa_throw(this,&cast_error::typeinfo,cast_error::~cast_error);
  }
  local_f3[0] = (type_caster)detail::load_type<bool>((handle *)local_10);
  pbVar2 = detail::type_caster::operator_cast_to_bool_(local_f3);
  return (enable_if_t<_detail::move_never<bool>::value,_bool>)(*pbVar2 & 1);
}

Assistant:

detail::enable_if_t<!detail::move_never<T>::value, T> move(object &&obj) {
    if (obj.ref_count() > 1)
#if defined(NDEBUG)
        throw cast_error("Unable to cast Python instance to C++ rvalue: instance has multiple references"
            " (compile in debug mode for details)");
#else
        throw cast_error("Unable to move from Python " + (std::string) str(obj.get_type()) +
                " instance to C++ " + type_id<T>() + " instance: instance has multiple references");
#endif

    // Move into a temporary and return that, because the reference may be a local value of `conv`
    T ret = std::move(detail::load_type<T>(obj).operator T&());
    return ret;
}